

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2padded_cell.cc
# Opt level: O3

S2Point * __thiscall S2PaddedCell::GetExitVertex(S2Point *__return_storage_ptr__,S2PaddedCell *this)

{
  undefined1 auVar1 [16];
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  S2Point local_28;
  
  iVar3 = 1 << (0x1eU - (char)this->level_ & 0x1f);
  iVar5 = this->ij_lo_[0];
  iVar4 = this->ij_lo_[1];
  if ((this->orientation_ == 3) || (this->orientation_ == 0)) {
    iVar5 = iVar5 + iVar3;
  }
  else {
    iVar4 = iVar4 + iVar3;
  }
  S2::FaceSiTitoXYZ(&local_28,(uint)((this->id_).id_ >> 0x3d),iVar5 * 2,iVar4 * 2);
  dVar2 = SQRT(local_28.c_[1] * local_28.c_[1] + local_28.c_[0] * local_28.c_[0] +
               local_28.c_[2] * local_28.c_[2]);
  dVar2 = (double)(~-(ulong)(dVar2 != 0.0) & (ulong)dVar2 |
                  (ulong)(1.0 / dVar2) & -(ulong)(dVar2 != 0.0));
  auVar1._8_4_ = SUB84(dVar2 * local_28.c_[1],0);
  auVar1._0_8_ = dVar2 * local_28.c_[0];
  auVar1._12_4_ = (int)((ulong)(dVar2 * local_28.c_[1]) >> 0x20);
  *(undefined1 (*) [16])__return_storage_ptr__->c_ = auVar1;
  __return_storage_ptr__->c_[2] = dVar2 * local_28.c_[2];
  return __return_storage_ptr__;
}

Assistant:

S2Point S2PaddedCell::GetExitVertex() const {
  // The curve exits at the (1,0) vertex unless the axes are swapped or
  // inverted but not both, in which case it exits at the (0,1) vertex.
  unsigned int i = ij_lo_[0];
  unsigned int j = ij_lo_[1];
  int ij_size = S2CellId::GetSizeIJ(level_);
  if (orientation_ == 0 || orientation_ == kSwapMask + kInvertMask) {
    i += ij_size;
  } else {
    j += ij_size;
  }
  return S2::FaceSiTitoXYZ(id_.face(), 2 * i, 2 * j).Normalize();
}